

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O0

void __thiscall tinyxml2::MemPoolT<104>::Clear(MemPoolT<104> *this)

{
  bool bVar1;
  Block *pBVar2;
  Block *b;
  MemPoolT<104> *this_local;
  
  while (bVar1 = DynArray<tinyxml2::MemPoolT<104>::Block_*,_10>::Empty(&this->_blockPtrs),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    pBVar2 = DynArray<tinyxml2::MemPoolT<104>::Block_*,_10>::Pop(&this->_blockPtrs);
    if (pBVar2 != (Block *)0x0) {
      operator_delete(pBVar2,0xfd8);
    }
  }
  this->_root = (Chunk *)0x0;
  this->_currentAllocs = 0;
  this->_nAllocs = 0;
  this->_maxAllocs = 0;
  this->_nUntracked = 0;
  return;
}

Assistant:

void Clear() {
        // Delete the blocks.
        while( !_blockPtrs.Empty()) {
            Block* b  = _blockPtrs.Pop();
            delete b;
        }
        _root = 0;
        _currentAllocs = 0;
        _nAllocs = 0;
        _maxAllocs = 0;
        _nUntracked = 0;
    }